

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlChar * xmlCatalogListXMLResolve(xmlCatalogEntryPtr catal,xmlChar *pubID,xmlChar *sysID)

{
  xmlCatalogEntryType xVar1;
  _xmlCatalogEntry **pp_Var2;
  int iVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  long lVar8;
  int nbList;
  uint uVar9;
  int iVar10;
  xmlCatalogEntryPtr catal_00;
  char *fmt;
  xmlCatalogEntryPtr pxVar11;
  _xmlCatalogEntry *p_Var12;
  ulong uVar13;
  _xmlCatalogEntry *p_Var14;
  xmlChar *delegates [50];
  int local_1dc;
  xmlCatalogEntryPtr local_1d8;
  undefined8 auStack_1c8 [51];
  
  if ((catal == (xmlCatalogEntryPtr)0x0) || (pubID == (xmlChar *)0x0 && sysID == (xmlChar *)0x0)) {
    return (xmlChar *)0x0;
  }
  pxVar5 = xmlCatalogNormalizePublic(pubID);
  if ((pxVar5 != (xmlChar *)0x0) && (pubID = (xmlChar *)0x0, *pxVar5 != '\0')) {
    pubID = pxVar5;
  }
  iVar3 = xmlStrncmp(pubID,(xmlChar *)"urn:publicid:",0xd);
  if (iVar3 == 0) {
    pubID = xmlCatalogUnWrapURN(pubID);
    pxVar6 = pubID;
    if (xmlDebugCatalogs == 0) goto LAB_00161039;
    if (pubID == (xmlChar *)0x0) {
      xmlCatalogPrintDebug("Public URN ID %s expanded to NULL\n");
      pxVar7 = xmlCatalogListXMLResolve(catal,(xmlChar *)0x0,sysID);
      goto LAB_00161052;
    }
    xmlCatalogPrintDebug("Public URN ID expanded to %s\n",pubID);
    pxVar7 = xmlCatalogListXMLResolve(catal,pubID,sysID);
  }
  else {
    iVar3 = xmlStrncmp(sysID,(xmlChar *)"urn:publicid:",0xd);
    if (iVar3 != 0) {
      do {
        if (catal->type == XML_CATA_CATALOG) {
          catal_00 = catal->children;
          if (catal_00 == (xmlCatalogEntryPtr)0x0) {
            xmlFetchXMLCatalogFile(catal);
            catal_00 = catal->children;
            if (catal_00 == (xmlCatalogEntryPtr)0x0) goto LAB_00160f53;
          }
          if (catal_00->depth < 0x33) {
            catal_00->depth = catal_00->depth + 1;
            if (sysID != (xmlChar *)0x0) {
              uVar13 = 0;
              local_1d8 = (xmlCatalogEntryPtr)0x0;
              iVar3 = 0;
              local_1dc = 0;
              p_Var12 = catal_00;
              do {
                switch(p_Var12->type) {
                case XML_CATA_NEXT_CATALOG:
                  iVar3 = iVar3 + 1;
                  break;
                case XML_CATA_SYSTEM:
                  iVar10 = xmlStrEqual(sysID,p_Var12->name);
                  if (iVar10 != 0) {
                    if (xmlDebugCatalogs != 0) {
                      xmlCatalogPrintDebug
                                ("Found system match %s, using %s\n",p_Var12->name,p_Var12->URL);
                    }
                    catal_00->depth = catal_00->depth + -1;
                    pxVar7 = xmlStrdup(p_Var12->URL);
                    goto LAB_00160f3b;
                  }
                  break;
                case XML_CATA_REWRITE_SYSTEM:
                  uVar9 = xmlStrlen(p_Var12->name);
                  if (((int)uVar13 < (int)uVar9) &&
                     (iVar10 = xmlStrncmp(sysID,p_Var12->name,uVar9), iVar10 == 0)) {
                    uVar13 = (ulong)uVar9;
                    local_1d8 = p_Var12;
                  }
                  break;
                case XML_CATA_DELEGATE_SYSTEM:
                  pxVar6 = p_Var12->name;
                  iVar10 = xmlStrlen(pxVar6);
                  iVar10 = xmlStrncmp(sysID,pxVar6,iVar10);
                  local_1dc = local_1dc + (uint)(iVar10 == 0);
                }
                p_Var12 = p_Var12->next;
              } while (p_Var12 != (_xmlCatalogEntry *)0x0);
              if (local_1d8 == (xmlCatalogEntryPtr)0x0) {
                if (local_1dc == 0) goto LAB_00160de7;
                uVar9 = 0;
                p_Var12 = catal_00;
                do {
                  p_Var14 = p_Var12;
                  while (p_Var14->type == XML_CATA_DELEGATE_SYSTEM) {
                    pxVar6 = p_Var14->name;
                    iVar3 = xmlStrlen(pxVar6);
                    iVar3 = xmlStrncmp(sysID,pxVar6,iVar3);
                    if (iVar3 != 0) break;
                    if ((int)uVar9 < 1) {
LAB_001611e8:
                      lVar8 = (long)(int)uVar9;
                      uVar9 = uVar9 + 1;
                      auStack_1c8[lVar8] = p_Var12->URL;
LAB_001611f6:
                      pxVar11 = p_Var12->children;
                      p_Var14 = p_Var12;
                      if (pxVar11 == (xmlCatalogEntryPtr)0x0) {
                        xmlFetchXMLCatalogFile(p_Var12);
                        pxVar11 = p_Var12->children;
                        if (pxVar11 == (xmlCatalogEntryPtr)0x0) break;
                      }
                      if (xmlDebugCatalogs != 0) {
                        xmlCatalogPrintDebug("Trying system delegate %s\n");
                        pxVar11 = p_Var12->children;
                      }
                      pxVar7 = xmlCatalogListXMLResolve(pxVar11,(xmlChar *)0x0,sysID);
                      if (pxVar7 != (xmlChar *)0x0) goto LAB_0016125f;
                      break;
                    }
                    uVar13 = 0;
                    while (iVar3 = xmlStrEqual(p_Var14->URL,(xmlChar *)auStack_1c8[uVar13]),
                          iVar3 == 0) {
                      uVar13 = uVar13 + 1;
                      if (uVar9 == uVar13) {
                        p_Var12 = p_Var14;
                        if ((int)uVar9 < 0x32) goto LAB_001611e8;
                        goto LAB_001611f6;
                      }
                    }
                    p_Var14 = p_Var14->next;
                    if (p_Var14 == (_xmlCatalogEntry *)0x0) goto LAB_00161253;
                  }
                  p_Var12 = p_Var14->next;
                } while (p_Var12 != (_xmlCatalogEntry *)0x0);
                goto LAB_00161253;
              }
              if (xmlDebugCatalogs != 0) {
                xmlCatalogPrintDebug("Using rewriting rule %s\n");
              }
              pxVar6 = xmlStrdup(local_1d8->URL);
              if (pxVar6 == (xmlChar *)0x0) {
                pxVar7 = (xmlChar *)0x0;
              }
              else {
                pxVar7 = xmlStrcat(pxVar6,sysID + uVar13);
              }
              catal_00->depth = catal_00->depth + -1;
LAB_00160f3b:
              if (pxVar7 == (xmlChar *)0x0) goto LAB_00160f44;
              goto LAB_00161052;
            }
            iVar3 = 0;
LAB_00160de7:
            if (pubID != (xmlChar *)0x0) {
              iVar10 = 0;
              p_Var12 = catal_00;
              do {
                xVar1 = p_Var12->type;
                if (xVar1 == XML_CATA_NEXT_CATALOG) {
                  iVar3 = iVar3 + (uint)(sysID == (xmlChar *)0x0);
                }
                else if (xVar1 == XML_CATA_DELEGATE_PUBLIC) {
                  pxVar6 = p_Var12->name;
                  iVar4 = xmlStrlen(pxVar6);
                  iVar4 = xmlStrncmp(pubID,pxVar6,iVar4);
                  if (iVar4 == 0) {
                    iVar10 = iVar10 + (uint)(p_Var12->prefer == XML_CATA_PREFER_PUBLIC);
                  }
                }
                else if ((xVar1 == XML_CATA_PUBLIC) &&
                        (iVar4 = xmlStrEqual(pubID,p_Var12->name), iVar4 != 0)) {
                  if (xmlDebugCatalogs != 0) {
                    xmlCatalogPrintDebug("Found public match %s\n");
                  }
                  catal_00->depth = catal_00->depth + -1;
                  pxVar7 = xmlStrdup(p_Var12->URL);
                  goto LAB_00160f3b;
                }
                p_Var12 = p_Var12->next;
              } while (p_Var12 != (_xmlCatalogEntry *)0x0);
              if (iVar10 != 0) {
                uVar9 = 0;
                p_Var12 = catal_00;
                goto LAB_00161086;
              }
            }
            p_Var12 = catal_00;
            if (iVar3 != 0) {
              do {
                if (p_Var12->type == XML_CATA_NEXT_CATALOG) {
                  pxVar11 = p_Var12->children;
                  if (pxVar11 == (xmlCatalogEntryPtr)0x0) {
                    xmlFetchXMLCatalogFile(p_Var12);
                    pxVar11 = p_Var12->children;
                    if (pxVar11 == (xmlCatalogEntryPtr)0x0) goto LAB_00160eb8;
                  }
                  pxVar7 = xmlCatalogListXMLResolve(pxVar11,pubID,sysID);
                  if (pxVar7 != (xmlChar *)0x0) {
                    catal_00->depth = catal_00->depth + -1;
                    goto LAB_00161052;
                  }
                  if (0x32 < catal_00->depth) goto LAB_00160f44;
                }
LAB_00160eb8:
                pp_Var2 = &p_Var12->next;
                p_Var12 = *pp_Var2;
              } while (*pp_Var2 != (_xmlCatalogEntry *)0x0);
            }
            catal_00->depth = catal_00->depth + -1;
            goto LAB_00160f44;
          }
          xmlCatalogErr(catal_00,(xmlNodePtr)0x0,0x676,"Detected recursion in catalog %s\n",
                        catal_00->name,(xmlChar *)0x0,(xmlChar *)0x0);
LAB_00160f44:
          if (catal->children->depth < 0x33) goto LAB_00160f53;
          break;
        }
LAB_00160f53:
        catal = catal->next;
      } while (catal != (_xmlCatalogEntry *)0x0);
      pxVar7 = (xmlChar *)0x0;
      goto LAB_00161052;
    }
    pxVar6 = xmlCatalogUnWrapURN(sysID);
    if (xmlDebugCatalogs != 0) {
      if (pxVar6 == (xmlChar *)0x0) {
        fmt = "System URN ID %s expanded to NULL\n";
      }
      else {
        fmt = "System URN ID expanded to %s\n";
        sysID = pxVar6;
      }
      xmlCatalogPrintDebug(fmt,sysID);
    }
    pxVar7 = pxVar6;
    if ((pubID == (xmlChar *)0x0) ||
       (iVar3 = xmlStrEqual(pubID,pxVar6), sysID = pxVar6, pxVar7 = pubID, iVar3 != 0)) {
      sysID = (xmlChar *)0x0;
      pubID = pxVar7;
    }
LAB_00161039:
    pxVar7 = xmlCatalogListXMLResolve(catal,pubID,sysID);
    pubID = pxVar6;
    if (pxVar6 == (xmlChar *)0x0) goto LAB_00161052;
  }
  (*xmlFree)(pubID);
LAB_00161052:
  if (pxVar5 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar5);
  }
  return pxVar7;
LAB_00161086:
  do {
    p_Var14 = p_Var12;
    while( true ) {
      if ((p_Var14->type != XML_CATA_DELEGATE_PUBLIC) || (p_Var14->prefer != XML_CATA_PREFER_PUBLIC)
         ) goto LAB_00161159;
      pxVar6 = p_Var14->name;
      iVar3 = xmlStrlen(pxVar6);
      iVar3 = xmlStrncmp(pubID,pxVar6,iVar3);
      if (iVar3 != 0) goto LAB_00161159;
      if ((int)uVar9 < 1) break;
      uVar13 = 0;
      while (iVar3 = xmlStrEqual(p_Var14->URL,(xmlChar *)auStack_1c8[uVar13]), iVar3 == 0) {
        uVar13 = uVar13 + 1;
        if (uVar9 == uVar13) {
          p_Var12 = p_Var14;
          if ((int)uVar9 < 0x32) goto LAB_001610fe;
          goto LAB_0016110c;
        }
      }
      p_Var14 = p_Var14->next;
      if (p_Var14 == (_xmlCatalogEntry *)0x0) goto LAB_00161253;
    }
LAB_001610fe:
    lVar8 = (long)(int)uVar9;
    uVar9 = uVar9 + 1;
    auStack_1c8[lVar8] = p_Var12->URL;
LAB_0016110c:
    pxVar11 = p_Var12->children;
    p_Var14 = p_Var12;
    if (pxVar11 == (xmlCatalogEntryPtr)0x0) {
      xmlFetchXMLCatalogFile(p_Var12);
      pxVar11 = p_Var12->children;
      if (pxVar11 != (xmlCatalogEntryPtr)0x0) goto LAB_0016112b;
    }
    else {
LAB_0016112b:
      if (xmlDebugCatalogs != 0) {
        xmlCatalogPrintDebug("Trying public delegate %s\n",p_Var12->URL);
        pxVar11 = p_Var12->children;
      }
      pxVar7 = xmlCatalogListXMLResolve(pxVar11,pubID,(xmlChar *)0x0);
      if (pxVar7 != (xmlChar *)0x0) goto LAB_0016125f;
    }
LAB_00161159:
    p_Var12 = p_Var14->next;
  } while (p_Var12 != (_xmlCatalogEntry *)0x0);
LAB_00161253:
  pxVar7 = (xmlChar *)0xffffffffffffffff;
LAB_0016125f:
  catal_00->depth = catal_00->depth + -1;
  goto LAB_00161052;
}

Assistant:

static xmlChar *
xmlCatalogListXMLResolve(xmlCatalogEntryPtr catal, const xmlChar *pubID,
	              const xmlChar *sysID) {
    xmlChar *ret = NULL;
    xmlChar *urnID = NULL;
    xmlChar *normid;

    if (catal == NULL)
        return(NULL);
    if ((pubID == NULL) && (sysID == NULL))
	return(NULL);

    normid = xmlCatalogNormalizePublic(pubID);
    if (normid != NULL)
        pubID = (*normid != 0 ? normid : NULL);

    if (!xmlStrncmp(pubID, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(pubID);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlCatalogPrintDebug(
			"Public URN ID %s expanded to NULL\n", pubID);
	    else
		xmlCatalogPrintDebug(
			"Public URN ID expanded to %s\n", urnID);
	}
	ret = xmlCatalogListXMLResolve(catal, urnID, sysID);
	if (urnID != NULL)
	    xmlFree(urnID);
	if (normid != NULL)
	    xmlFree(normid);
	return(ret);
    }
    if (!xmlStrncmp(sysID, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(sysID);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlCatalogPrintDebug(
			"System URN ID %s expanded to NULL\n", sysID);
	    else
		xmlCatalogPrintDebug(
			"System URN ID expanded to %s\n", urnID);
	}
	if (pubID == NULL)
	    ret = xmlCatalogListXMLResolve(catal, urnID, NULL);
	else if (xmlStrEqual(pubID, urnID))
	    ret = xmlCatalogListXMLResolve(catal, pubID, NULL);
	else {
	    ret = xmlCatalogListXMLResolve(catal, pubID, urnID);
	}
	if (urnID != NULL)
	    xmlFree(urnID);
	if (normid != NULL)
	    xmlFree(normid);
	return(ret);
    }
    while (catal != NULL) {
	if (catal->type == XML_CATA_CATALOG) {
	    if (catal->children == NULL) {
		xmlFetchXMLCatalogFile(catal);
	    }
	    if (catal->children != NULL) {
		ret = xmlCatalogXMLResolve(catal->children, pubID, sysID);
		if (ret != NULL) {
		    break;
                } else if (catal->children->depth > MAX_CATAL_DEPTH) {
	            ret = NULL;
		    break;
	        }
	    }
	}
	catal = catal->next;
    }
    if (normid != NULL)
	xmlFree(normid);
    return(ret);
}